

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QDebug __thiscall QVariant::qdebugHelper(QVariant *this,QDebug *dbg)

{
  int iVar1;
  QDebug *this_00;
  QDebug *in_RDX;
  Stream *in_RDI;
  long in_FS_OFFSET;
  bool streamed;
  uint typeId;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char t;
  QVariant *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  QDebug *in_stack_ffffffffffffff30;
  QDebug *in_stack_ffffffffffffff38;
  QDebugStateSaver *in_stack_ffffffffffffff40;
  QDebug *in_stack_ffffffffffffff48;
  QMetaType local_20;
  QMetaTypeInterface *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_18 = (QMetaTypeInterface *)Private::type(&in_stack_ffffffffffffff20->d);
  iVar1 = QMetaType::id((QMetaType *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  QDebug::nospace(in_RDX);
  QDebug::operator<<(in_stack_ffffffffffffff48,(char *)in_RDI);
  if (iVar1 == 0) {
    QDebug::operator<<(in_stack_ffffffffffffff48,(char *)in_RDI);
    t = (char)((uint)in_stack_ffffffffffffff1c >> 0x18);
  }
  else {
    local_20 = Private::type(&in_stack_ffffffffffffff20->d);
    this_00 = (QDebug *)QMetaType::name(&local_20);
    QDebug::operator<<(this_00,(char *)in_RDI);
    QDebug::operator<<(this_00,(char *)in_RDI);
    Private::type(&in_stack_ffffffffffffff20->d);
    in_stack_ffffffffffffff30 = (QDebug *)Private::storage(&in_stack_ffffffffffffff20->d);
    in_stack_ffffffffffffff2f =
         QMetaType::debugStream
                   ((QMetaType *)
                    CONCAT17(in_stack_ffffffffffffff2f,
                             CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                    (QDebug *)in_stack_ffffffffffffff20,
                    (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if ((!(bool)in_stack_ffffffffffffff2f) &&
       (in_stack_ffffffffffffff2e = canConvert<QString>(in_stack_ffffffffffffff20),
       (bool)in_stack_ffffffffffffff2e)) {
      toString((QVariant *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QDebug::operator<<(in_stack_ffffffffffffff30,
                         (QString *)
                         CONCAT17(in_stack_ffffffffffffff2f,
                                  CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
      QString::~QString((QString *)0x438c95);
    }
    t = (char)((uint)in_stack_ffffffffffffff1c >> 0x18);
  }
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff20,t);
  QDebug::QDebug(in_stack_ffffffffffffff30,
                 (QDebug *)
                 CONCAT17(in_stack_ffffffffffffff2f,
                          CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)in_RDI;
}

Assistant:

QDebug QVariant::qdebugHelper(QDebug dbg) const
{
    QDebugStateSaver saver(dbg);
    const uint typeId = d.type().id();
    dbg.nospace() << "QVariant(";
    if (typeId != QMetaType::UnknownType) {
        dbg << d.type().name() << ", ";
        bool streamed = d.type().debugStream(dbg, d.storage());
        if (!streamed && canConvert<QString>())
            dbg << toString();
    } else {
        dbg << "Invalid";
    }
    dbg << ')';
    return dbg;
}